

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint HuffmanTree_makeFromFrequencies
               (HuffmanTree *tree,uint *frequencies,size_t mincodes,size_t numcodes,uint maxbitlen)

{
  ulong numcodes_00;
  long lVar1;
  uint uVar2;
  uint *lengths;
  ulong uVar3;
  size_t __size;
  
  __size = numcodes * 4 + 4;
  uVar3 = numcodes + 1;
  do {
    numcodes_00 = uVar3 - 1;
    __size = __size - 4;
    if (numcodes_00 <= mincodes) break;
    lVar1 = uVar3 - 2;
    uVar3 = numcodes_00;
  } while (frequencies[lVar1] == 0);
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (uint)numcodes_00;
  lengths = (uint *)realloc(tree->lengths,__size);
  tree->lengths = lengths;
  if (lengths == (uint *)0x0) {
    uVar2 = 0x53;
  }
  else {
    if (numcodes_00 != 0) {
      memset(lengths,0,__size);
    }
    uVar2 = lodepng_huffman_code_lengths(lengths,frequencies,numcodes_00,maxbitlen);
    if (uVar2 == 0) {
      uVar2 = HuffmanTree_makeFromLengths2(tree);
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

static unsigned HuffmanTree_makeFromFrequencies(HuffmanTree* tree, const unsigned* frequencies,
                                                size_t mincodes, size_t numcodes, unsigned maxbitlen) {
  size_t i;
  unsigned error = 0;
  while(!frequencies[numcodes - 1] && numcodes > mincodes) --numcodes; /*trim zeroes*/
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->lengths = (unsigned*)lodepng_realloc(tree->lengths, numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  /*initialize all lengths to 0*/
  for(i = 0; i < numcodes; i++) tree->lengths[i] = 0;

  error = lodepng_huffman_code_lengths(tree->lengths, frequencies, numcodes, maxbitlen);
  if(!error) error = HuffmanTree_makeFromLengths2(tree);
  return error;
}